

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNIfBase::fold_constants(CTPNIfBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  iVar1 = (*(this->first_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])();
  this->first_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->second_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])(this->second_,symtab);
  this->second_ = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*(this->third_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])(this->third_,symtab);
  this->third_ = (CTcPrsNode *)CONCAT44(extraout_var_01,iVar1);
  iVar1 = (*(this->first_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var_02,iVar1) != 0) {
    iVar1 = (*(this->first_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    iVar1 = CTcConstVal::get_val_bool((CTcConstVal *)CONCAT44(extraout_var_03,iVar1));
    this = (CTPNIfBase *)(&this->second_)[iVar1 == 0];
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNIfBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold constants in the subnodes */
    first_ = first_->fold_constants(symtab);
    second_ = second_->fold_constants(symtab);
    third_ = third_->fold_constants(symtab);

    /* 
     *   if the first is now a constant, we can fold this entire
     *   expression node by choosing the second or third based on its
     *   value; otherwise, return myself unchanged 
     */
    if (first_->is_const())
    {
        /* 
         *   The condition is a constant - the result is the 'then' or 'else'
         *   part, based on the condition's value.  
         */
        return (first_->get_const_val()->get_val_bool()
                ? second_ : third_);
    }
    else
    {
        /* we can't fold this node any further - return it unchanged */
        return this;
    }
}